

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O1

void __thiscall duckdb::PlanEnumerator::GenerateCrossProducts(PlanEnumerator *this)

{
  bool bVar1;
  bool bVar2;
  JoinRelationSet *left;
  JoinRelationSet *right;
  QueryGraphEdges *this_00;
  QueryGraphManager *pQVar3;
  idx_t relation_id;
  idx_t index;
  
  pQVar3 = this->query_graph_manager;
  if ((pQVar3->relation_manager).relations.
      super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pQVar3->relation_manager).relations.
      super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    index = 0;
    do {
      left = JoinRelationSetManager::GetJoinRelation(&pQVar3->set_manager,index);
      pQVar3 = this->query_graph_manager;
      if ((pQVar3->relation_manager).relations.
          super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pQVar3->relation_manager).relations.
          super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        relation_id = 0;
        do {
          bVar1 = RelationManager::CrossProductWithRelationAllowed(&pQVar3->relation_manager,index);
          bVar2 = true;
          if (bVar1) {
            bVar2 = RelationManager::CrossProductWithRelationAllowed
                              (&pQVar3->relation_manager,relation_id);
            bVar2 = !bVar2;
          }
          if ((index != relation_id) && (!bVar2)) {
            right = JoinRelationSetManager::GetJoinRelation(&pQVar3->set_manager,relation_id);
            this_00 = &this->query_graph_manager->query_graph;
            QueryGraphEdges::CreateEdge
                      (this_00,left,right,(optional_ptr<duckdb::FilterInfo,_true>)0x0);
            QueryGraphEdges::CreateEdge
                      (this_00,right,left,(optional_ptr<duckdb::FilterInfo,_true>)0x0);
          }
          relation_id = relation_id + 1;
          pQVar3 = this->query_graph_manager;
        } while (relation_id <
                 (ulong)((long)(pQVar3->relation_manager).relations.
                               super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pQVar3->relation_manager).relations.
                               super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      index = index + 1;
      pQVar3 = this->query_graph_manager;
    } while (index < (ulong)((long)(pQVar3->relation_manager).relations.
                                   super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pQVar3->relation_manager).relations.
                                   super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void PlanEnumerator::GenerateCrossProducts() {
	// generate a set of cross products to combine the currently available plans into a full join plan
	// we create edges between every relation with a high cost
	for (idx_t i = 0; i < query_graph_manager.relation_manager.NumRelations(); i++) {
		auto &left = query_graph_manager.set_manager.GetJoinRelation(i);
		for (idx_t j = 0; j < query_graph_manager.relation_manager.NumRelations(); j++) {
			auto cross_product_allowed = query_graph_manager.relation_manager.CrossProductWithRelationAllowed(i) &&
			                             query_graph_manager.relation_manager.CrossProductWithRelationAllowed(j);
			if (i != j && cross_product_allowed) {
				auto &right = query_graph_manager.set_manager.GetJoinRelation(j);
				query_graph_manager.CreateQueryGraphCrossProduct(left, right);
			}
		}
	}
	// Now that the query graph has new edges, we need to re-initialize our query graph.
	// TODO: do we need to initialize our qyery graph again?
	// query_graph = query_graph_manager.GetQueryGraph();
}